

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qinputdialog.cpp
# Opt level: O2

void __thiscall QInputDialogPrivate::textChanged(QInputDialogPrivate *this,QString *text)

{
  QInputDialog *this_00;
  bool bVar1;
  
  this_00 = *(QInputDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  bVar1 = ::operator!=(&this->textValue,text);
  if (bVar1) {
    QString::operator=(&this->textValue,(QString *)text);
    QInputDialog::textValueChanged(this_00,text);
    return;
  }
  return;
}

Assistant:

void QInputDialogPrivate::textChanged(const QString &text)
{
    Q_Q(QInputDialog);
    if (textValue != text) {
        textValue = text;
        emit q->textValueChanged(text);
    }
}